

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access-control.c
# Opt level: O2

void ndn_ac_register_access_request(uint8_t service)

{
  long lVar1;
  long lVar2;
  
  if (!_ac_initialized) {
    _init_ac_state();
  }
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 10) {
      return;
    }
    lVar1 = lVar2 + 1;
  } while (_ac_self_state.access_services[lVar2] != 0xff);
  _ac_self_state.access_services[lVar2] = service;
  return;
}

Assistant:

void
ndn_ac_register_access_request(uint8_t service)
{
  if (!_ac_initialized) {
    _init_ac_state();
  }
  for (int i = 0; i < 10; i++) {
    if (_ac_self_state.access_services[i] == NDN_SD_NONE) {
      _ac_self_state.access_services[i] = service;
      return;
    }
  }
}